

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O2

FuncVec * __thiscall
dg::llvmdg::LazyLLVMCallGraph::callees
          (FuncVec *__return_storage_ptr__,LazyLLVMCallGraph *this,Function *F)

{
  pointer ppFVar1;
  bool bVar2;
  FuncNode *pFVar3;
  pointer ppFVar4;
  Function *local_20;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20 = F;
  bVar2 = hasFn(this,F);
  if (!bVar2) {
    _populateCalledFunctions(this,F);
  }
  pFVar3 = GenericCallGraph<const_llvm::Function_*>::get(&this->_cg,&local_20);
  ppFVar1 = (pFVar3->_calls).
            super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar4 = (pFVar3->_calls).
                 super__Vector_base<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*,_std::allocator<dg::GenericCallGraph<const_llvm::Function_*>::FuncNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar4 != ppFVar1;
      ppFVar4 = ppFVar4 + 1) {
    std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
              (__return_storage_ptr__,&(*ppFVar4)->value);
  }
  return __return_storage_ptr__;
}

Assistant:

FuncVec callees(const llvm::Function *F) override {
        FuncVec ret;
        if (!hasFn(F)) {
            _populateCalledFunctions(F);
        }
        auto fnd = _cg.get(F);
        for (auto *nd : fnd->getCalls()) {
            ret.push_back(nd->getValue());
        }
        return ret;
    }